

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circuit_oram_opt.h
# Opt level: O0

int __thiscall CircuitOramOpt::access(CircuitOramOpt *this,char *__name,int __type)

{
  bool bVar1;
  int unaff_retaddr;
  Bucket<int> *in_stack_00000008;
  int i;
  bool res;
  int in_stack_0000012c;
  CircuitOram *in_stack_00000130;
  int in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 in_stack_ffffffffffffffec;
  int iVar2;
  
  bVar1 = TreeOram::readAndRemove
                    ((TreeOram *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
                     (int)((ulong)this >> 0x20));
  Bucket<int>::add(in_stack_00000008,unaff_retaddr);
  TreeOram::update_pos((TreeOram *)this,in_stack_ffffffffffffffdc);
  this->cnt2 = this->cnt2 + 1;
  iVar2 = this->cnt2;
  if (iVar2 == this->naccess) {
    this->cnt2 = 0;
    for (iVar2 = 0; iVar2 < this->nevict; iVar2 = iVar2 + 1) {
      reverse_order(this);
      CircuitOram::flush(in_stack_00000130,in_stack_0000012c);
    }
  }
  return CONCAT31((int3)((uint)iVar2 >> 8),bVar1);
}

Assistant:

bool access(int identifier)
      {
         bool res = readAndRemove(identifier);
         stash->add(identifier);
         update_pos(identifier);
         cnt2++;
         if(cnt2 == naccess) {
            cnt2 = 0;
            for(int i = 0; i < nevict; ++i) {
               flush(reverse_order());
            }
         }
         return res;
      }